

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_64_67(QPDF *pdf,char *arg2,bool allow_shrink,bool allow_expand)

{
  Rectangle RVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  QPDFPageObjectHelper *local_2f8;
  QPDFWriter local_2e0 [8];
  QPDFWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  QPDFObjectHandle local_2b0;
  allocator<char> local_299;
  string local_298 [32];
  QPDFObjectHandle local_278;
  allocator<char> local_261;
  string local_260 [32];
  QPDFObjectHandle local_240;
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  QPDFObjectHandle local_1e0;
  QPDFObjectHandle local_1d0;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  double dStack_1a8;
  QPDFObjectHandle local_1a0;
  undefined1 local_190 [8];
  string content;
  string local_168 [32];
  string local_148 [8];
  string name;
  string local_120 [32];
  undefined1 local_100 [8];
  QPDFObjectHandle resources;
  undefined1 local_e8 [4];
  int min_suffix;
  undefined1 local_d8 [8];
  QPDFObjectHandle fo;
  QPDFPageObjectHelper *ph2;
  QPDFPageObjectHelper *ph1;
  size_t i;
  size_t npages;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_88 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages2;
  QPDFPageDocumentHelper local_70;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_50 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages1;
  QPDF local_28 [8];
  QPDF pdf2;
  bool allow_expand_local;
  bool allow_shrink_local;
  char *arg2_local;
  QPDF *pdf_local;
  
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(local_28);
    QPDF::processFile((char *)local_28,arg2);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_70,pdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_70);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&npages,local_28);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&npages);
    sVar2 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size(local_50)
    ;
    sVar3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size(local_88)
    ;
    if (sVar2 < sVar3) {
      local_2f8 = (QPDFPageObjectHelper *)
                  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                            (local_50);
    }
    else {
      local_2f8 = (QPDFPageObjectHelper *)
                  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                            (local_88);
    }
    for (ph1 = (QPDFPageObjectHelper *)0x0; ph1 < local_2f8;
        ph1 = (QPDFPageObjectHelper *)&ph1->field_0x1) {
      pvVar4 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                         (local_50,(size_type)ph1);
      fo.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                         (local_88,(size_type)ph1);
      QPDFPageObjectHelper::getFormXObjectForPage(SUB81(local_e8,0));
      QPDF::copyForeignObject((QPDFObjectHandle *)local_d8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
      resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_120,"/Resources",(allocator<char> *)(name.field_2._M_local_buf + 0xf));
      QPDFPageObjectHelper::getAttribute((string *)local_100,SUB81(pvVar4,0));
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_168,"/Fx",(allocator<char> *)(content.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::getUniqueResourceName(local_148,(int *)local_100,(set *)local_168);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)(content.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::QPDFObjectHandle(&local_1a0,(QPDFObjectHandle *)local_d8);
      QPDFPageObjectHelper::getTrimBox(SUB81(&local_1d0,0),SUB81(pvVar4,0));
      QPDFObjectHandle::getArrayAsRectangle();
      RVar1.lly = (double)uStack_1b8;
      RVar1.llx = (double)local_1c0;
      RVar1.urx = (double)local_1b0;
      RVar1.ury = dStack_1a8;
      QPDFPageObjectHelper::placeFormXObject
                ((QPDFObjectHandle *)local_190,(string *)pvVar4,RVar1,SUB81(&local_1a0,0),
                 SUB81(local_148,0),false);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1d0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_200,"<< /XObject << >> >>",&local_201);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_228,"",&local_229);
        QPDFObjectHandle::parse((string *)&local_1e0,local_200);
        QPDFObjectHandle::mergeResources((QPDFObjectHandle *)local_100,(map *)&local_1e0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator(&local_229);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator(&local_201);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_260,"/XObject",&local_261);
        QPDFObjectHandle::getKey((string *)&local_240);
        QPDFObjectHandle::replaceKey((string *)&local_240,(QPDFObjectHandle *)local_148);
        QPDFObjectHandle::~QPDFObjectHandle(&local_240);
        std::__cxx11::string::~string(local_260);
        std::allocator<char>::~allocator(&local_261);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_298,"q\n",&local_299);
        QPDFObjectHandle::newStream((QPDF *)&local_278,(string *)pdf);
        QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)pvVar4,SUB81(&local_278,0));
        QPDFObjectHandle::~QPDFObjectHandle(&local_278);
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator(&local_299);
        std::operator+(&local_2d0,"\nQ\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_190);
        QPDFObjectHandle::newStream((QPDF *)&local_2b0,(string *)pdf);
        QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)pvVar4,SUB81(&local_2b0,0));
        QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string(local_148);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
    }
    QPDFWriter::QPDFWriter(local_2e0,pdf,"a.pdf");
    QPDFWriter::setQDFMode(SUB81(local_2e0,0));
    QPDFWriter::setStaticID(SUB81(local_2e0,0));
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_2e0);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_88);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_50);
    QPDF::~QPDF(local_28);
    return;
  }
  __assert_fail("arg2",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x91c,"void test_64_67(QPDF &, const char *, bool, bool)");
}

Assistant:

static void
test_64_67(QPDF& pdf, char const* arg2, bool allow_shrink, bool allow_expand)
{
    // Overlay file2 on file1.
    // 64: allow neither shrink nor shrink
    // 65: allow shrink but not expand
    // 66: allow expand but not shrink
    // 67: allow both shrink and expand

    // Placing form XObjects: expand, shrink
    assert(arg2);
    QPDF pdf2;
    pdf2.processFile(arg2);

    std::vector<QPDFPageObjectHelper> pages1 = QPDFPageDocumentHelper(pdf).getAllPages();
    std::vector<QPDFPageObjectHelper> pages2 = QPDFPageDocumentHelper(pdf2).getAllPages();
    size_t npages = (pages1.size() < pages2.size() ? pages1.size() : pages2.size());
    for (size_t i = 0; i < npages; ++i) {
        QPDFPageObjectHelper& ph1 = pages1.at(i);
        QPDFPageObjectHelper& ph2 = pages2.at(i);
        QPDFObjectHandle fo = pdf.copyForeignObject(ph2.getFormXObjectForPage());
        int min_suffix = 1;
        QPDFObjectHandle resources = ph1.getAttribute("/Resources", true);
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);
        std::string content = ph1.placeFormXObject(
            fo, name, ph1.getTrimBox().getArrayAsRectangle(), false, allow_shrink, allow_expand);
        if (!content.empty()) {
            resources.mergeResources(QPDFObjectHandle::parse("<< /XObject << >> >>"));
            resources.getKey("/XObject").replaceKey(name, fo);
            ph1.addPageContents(QPDFObjectHandle::newStream(&pdf, "q\n"), true);
            ph1.addPageContents(QPDFObjectHandle::newStream(&pdf, "\nQ\n" + content), false);
        }
    }
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}